

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
          (ArgBuilder *this,_func_void_ConfigData_ptr *unaryFunction)

{
  BoundArgFunction<Catch::ConfigData> local_18;
  
  local_18.functionObj = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  (local_18.functionObj)->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_00172970;
  local_18.functionObj[1]._vptr_IArgFunction = (_func_int **)unaryFunction;
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            ((BoundArgFunction<Catch::ConfigData> *)this->m_arg,&local_18);
  if (local_18.functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*(local_18.functionObj)->_vptr_IArgFunction[1])();
  }
  return;
}

Assistant:

void bind( void (* unaryFunction)( C& ) ) {
                m_arg->boundField = new Detail::BoundUnaryFunction<C>( unaryFunction );
            }